

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

void assert_wait_child(pid_t child_pid)

{
  uint uVar1;
  int iVar2;
  uint child_pid_00;
  __pid_t child_pid_01;
  ssize_t sVar3;
  uv_loop_t *puVar4;
  uint extraout_EDX;
  uint uVar5;
  uv_poll_t *puVar6;
  undefined1 *__buf;
  uv_loop_t *loop;
  char *loop_00;
  int child_stat;
  undefined1 uStack_1b1;
  int iStack_1b0;
  uint uStack_1ac;
  undefined1 auStack_1a8 [8];
  undefined1 auStack_1a0 [176];
  uv_loop_t *puStack_f0;
  uv_loop_t *puStack_e8;
  int iStack_d8;
  uint uStack_d4;
  undefined1 auStack_d0 [180];
  uint local_1c;
  
  puVar4 = (uv_loop_t *)(ulong)(uint)child_pid;
  auStack_d0._160_8_ = (__pthread_internal_list *)0x14c556;
  uVar1 = waitpid(child_pid,(int *)&local_1c,0);
  auStack_d0._160_8_ = (__pthread_internal_list *)0x14c56b;
  printf("Waited pid is %d with status %d\n",(ulong)uVar1,(ulong)local_1c);
  if (uVar1 == 0xffffffff) {
    auStack_d0._160_8_ = (__pthread_internal_list *)0x14c598;
    perror("Failed to wait");
  }
  if (uVar1 == child_pid) {
    if ((local_1c & 0x7f) != 0) goto LAB_0014c59f;
    if ((local_1c & 0xff00) == 0) {
      return;
    }
  }
  else {
    auStack_d0._160_8_ = (__pthread_internal_list *)0x14c59f;
    assert_wait_child_cold_1();
LAB_0014c59f:
    auStack_d0._160_8_ = (__pthread_internal_list *)0x14c5a4;
    assert_wait_child_cold_2();
  }
  auStack_d0._160_8_ = run_test_fork_socketpair;
  assert_wait_child_cold_3();
  puStack_e8 = (uv_loop_t *)0x14c5b6;
  auStack_d0._160_8_ = puVar4;
  run_timer_loop_once();
  loop = (uv_loop_t *)0x1;
  uVar5 = 1;
  puStack_e8 = (uv_loop_t *)0x14c5cc;
  iVar2 = socketpair(1,1,0,&iStack_d8);
  if (iVar2 == 0) {
    puStack_e8 = (uv_loop_t *)0x14c5d9;
    loop = uv_default_loop();
    puVar6 = (uv_poll_t *)auStack_d0;
    puStack_e8 = (uv_loop_t *)0x14c5ea;
    iVar2 = uv_poll_init(loop,puVar6,iStack_d8);
    uVar5 = (uint)puVar6;
    if (iVar2 != 0) goto LAB_0014c6dc;
    puStack_e8 = (uv_loop_t *)0x14c5f7;
    child_pid_00 = fork();
    if (child_pid_00 != 0) {
      puVar4 = (uv_loop_t *)(ulong)child_pid_00;
      if (child_pid_00 == 0xffffffff) goto LAB_0014c6e6;
      loop = (uv_loop_t *)(ulong)uStack_d4;
      uVar5 = 0x19271a;
      puStack_e8 = (uv_loop_t *)0x14c61d;
      sVar3 = send(uStack_d4,"hi\n",3,0);
      if (sVar3 == 3) {
        puStack_e8 = (uv_loop_t *)0x14c62e;
        assert_wait_child(child_pid_00);
LAB_0014c698:
        puStack_e8 = (uv_loop_t *)0x14c69d;
        puVar4 = uv_default_loop();
        puStack_e8 = (uv_loop_t *)0x14c6b1;
        uv_walk(puVar4,close_walk_cb,(void *)0x0);
        uVar5 = 0;
        puStack_e8 = (uv_loop_t *)0x14c6bb;
        uv_run(puVar4,UV_RUN_DEFAULT);
        puStack_e8 = (uv_loop_t *)0x14c6c0;
        loop = uv_default_loop();
        puStack_e8 = (uv_loop_t *)0x14c6c8;
        iVar2 = uv_loop_close(loop);
        if (iVar2 == 0) {
          return;
        }
        goto LAB_0014c6e1;
      }
      goto LAB_0014c6eb;
    }
    puStack_e8 = (uv_loop_t *)0x14c635;
    loop = uv_default_loop();
    puStack_e8 = (uv_loop_t *)0x14c63d;
    iVar2 = uv_loop_fork(loop);
    if (iVar2 != 0) goto LAB_0014c6f0;
    if (socket_cb_called != 0) goto LAB_0014c6f5;
    loop = (uv_loop_t *)auStack_d0;
    uVar5 = 1;
    puStack_e8 = (uv_loop_t *)0x14c668;
    iVar2 = uv_poll_start((uv_poll_t *)loop,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014c6fa;
    puStack_e8 = (uv_loop_t *)0x14c67c;
    puts("Going to run the loop in the child");
    puStack_e8 = (uv_loop_t *)0x14c681;
    loop = uv_default_loop();
    uVar5 = 0;
    puStack_e8 = (uv_loop_t *)0x14c68b;
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0014c6ff;
    if (socket_cb_called == 1) goto LAB_0014c698;
  }
  else {
    puStack_e8 = (uv_loop_t *)0x14c6dc;
    run_test_fork_socketpair_cold_1();
LAB_0014c6dc:
    puStack_e8 = (uv_loop_t *)0x14c6e1;
    run_test_fork_socketpair_cold_2();
LAB_0014c6e1:
    puStack_e8 = (uv_loop_t *)0x14c6e6;
    run_test_fork_socketpair_cold_10();
LAB_0014c6e6:
    puStack_e8 = (uv_loop_t *)0x14c6eb;
    run_test_fork_socketpair_cold_8();
LAB_0014c6eb:
    puStack_e8 = (uv_loop_t *)0x14c6f0;
    run_test_fork_socketpair_cold_9();
LAB_0014c6f0:
    puStack_e8 = (uv_loop_t *)0x14c6f5;
    run_test_fork_socketpair_cold_3();
LAB_0014c6f5:
    puStack_e8 = (uv_loop_t *)0x14c6fa;
    run_test_fork_socketpair_cold_4();
LAB_0014c6fa:
    puStack_e8 = (uv_loop_t *)0x14c6ff;
    run_test_fork_socketpair_cold_5();
LAB_0014c6ff:
    puStack_e8 = (uv_loop_t *)0x14c704;
    run_test_fork_socketpair_cold_6();
  }
  puStack_e8 = (uv_loop_t *)socket_cb;
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_f0 = puVar4;
  puStack_e8 = (uv_loop_t *)(ulong)uVar1;
  if (uVar5 == 0) {
    auStack_1a0._160_8_ = (__pthread_internal_list *)0x14c72b;
    uVar5 = extraout_EDX;
    printf("Socket cb got events %d\n");
    puVar4 = loop;
    if ((extraout_EDX & 1) == 0) goto LAB_0014c777;
    if (socket_cb_read_fd == 0) {
LAB_0014c762:
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      return;
    }
    uVar5 = 0x2f8ec0;
    auStack_1a0._160_8_ = (__pthread_internal_list *)0x14c752;
    sVar3 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar3 == (ulong)socket_cb_read_size * 3) goto LAB_0014c762;
  }
  else {
    auStack_1a0._160_8_ = (__pthread_internal_list *)0x14c777;
    socket_cb_cold_1();
LAB_0014c777:
    auStack_1a0._160_8_ = (__pthread_internal_list *)0x14c77c;
    socket_cb_cold_3();
  }
  auStack_1a0._160_8_ = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  loop_00 = auStack_1a8;
  auStack_1a0._160_8_ = puVar4;
  iVar2 = pipe((int *)loop_00);
  if (iVar2 == 0) {
    run_timer_loop_once();
    loop_00 = (char *)0x1;
    uVar5 = 1;
    iVar2 = socketpair(1,1,0,&iStack_1b0);
    if (iVar2 != 0) goto LAB_0014c9dd;
    loop_00 = (char *)uv_default_loop();
    puVar6 = (uv_poll_t *)auStack_1a0;
    iVar2 = uv_poll_init((uv_loop_t *)loop_00,puVar6,iStack_1b0);
    uVar5 = (uint)puVar6;
    if (iVar2 != 0) goto LAB_0014c9e2;
    loop_00 = auStack_1a0;
    uVar5 = 1;
    iVar2 = uv_poll_start((uv_poll_t *)loop_00,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014c9e7;
    loop_00 = (char *)uv_default_loop();
    uVar5 = 2;
    iVar2 = uv_run((uv_loop_t *)loop_00,UV_RUN_NOWAIT);
    if (iVar2 != 1) goto LAB_0014c9ec;
    child_pid_01 = fork();
    if (child_pid_01 != 0) {
      if (child_pid_01 == -1) goto LAB_0014c9f6;
      loop_00 = auStack_1a0;
      iVar2 = uv_poll_stop((uv_poll_t *)loop_00);
      if (iVar2 != 0) goto LAB_0014c9fb;
      uv_close((uv_handle_t *)auStack_1a0,(uv_close_cb)0x0);
      loop_00 = (char *)uv_default_loop();
      uVar5 = 0;
      iVar2 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
      if (iVar2 != 0) goto LAB_0014ca05;
      if (socket_cb_called != 0) goto LAB_0014ca0f;
      loop_00 = (char *)(ulong)(uint)auStack_1a8._4_4_;
      uVar5 = 0x19323c;
      sVar3 = write(auStack_1a8._4_4_,"1",1);
      if (sVar3 != 1) goto LAB_0014ca19;
      loop_00 = (char *)(ulong)uStack_1ac;
      uVar5 = 0x19271a;
      sVar3 = send(uStack_1ac,"hi\n",3,0);
      if (sVar3 != 3) goto LAB_0014ca23;
      loop_00 = (char *)uv_default_loop();
      uVar5 = 0;
      iVar2 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
      if (iVar2 == 0) {
        if (socket_cb_called != 0) goto LAB_0014ca37;
        assert_wait_child(child_pid_01);
        goto LAB_0014c999;
      }
      goto LAB_0014ca2d;
    }
    uVar1 = getpid();
    printf("Child is %d\n",(ulong)uVar1);
    loop_00 = (char *)(ulong)(uint)auStack_1a8._0_4_;
    __buf = &uStack_1b1;
    sVar3 = read(auStack_1a8._0_4_,__buf,1);
    uVar5 = (uint)__buf;
    if (sVar3 != 1) goto LAB_0014ca00;
    loop_00 = (char *)uv_default_loop();
    iVar2 = uv_loop_fork((uv_loop_t *)loop_00);
    if (iVar2 != 0) goto LAB_0014ca0a;
    if (socket_cb_called != 0) goto LAB_0014ca14;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_1b0;
    socket_cb_read_size = 1;
    loop_00 = (char *)uv_default_loop();
    uVar5 = 0;
    iVar2 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0014ca1e;
    if (socket_cb_called != 1) goto LAB_0014ca28;
    loop_00 = "Buf %s\n";
    uVar5 = 0x2f8ec0;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0014c999:
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uVar5 = 0;
      uv_run(puVar4,UV_RUN_DEFAULT);
      loop_00 = (char *)uv_default_loop();
      iVar2 = uv_loop_close((uv_loop_t *)loop_00);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0014c9f1;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_0014c9dd:
    run_test_fork_socketpair_started_cold_2();
LAB_0014c9e2:
    run_test_fork_socketpair_started_cold_3();
LAB_0014c9e7:
    run_test_fork_socketpair_started_cold_4();
LAB_0014c9ec:
    run_test_fork_socketpair_started_cold_5();
LAB_0014c9f1:
    run_test_fork_socketpair_started_cold_20();
LAB_0014c9f6:
    run_test_fork_socketpair_started_cold_12();
LAB_0014c9fb:
    run_test_fork_socketpair_started_cold_13();
LAB_0014ca00:
    run_test_fork_socketpair_started_cold_6();
LAB_0014ca05:
    run_test_fork_socketpair_started_cold_14();
LAB_0014ca0a:
    run_test_fork_socketpair_started_cold_7();
LAB_0014ca0f:
    run_test_fork_socketpair_started_cold_15();
LAB_0014ca14:
    run_test_fork_socketpair_started_cold_8();
LAB_0014ca19:
    run_test_fork_socketpair_started_cold_16();
LAB_0014ca1e:
    run_test_fork_socketpair_started_cold_9();
LAB_0014ca23:
    run_test_fork_socketpair_started_cold_17();
LAB_0014ca28:
    run_test_fork_socketpair_started_cold_10();
LAB_0014ca2d:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0014ca37:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar5;
  uv_close((uv_handle_t *)loop_00,(uv_close_cb)0x0);
  return;
}

Assistant:

static void assert_wait_child(pid_t child_pid) {
  pid_t waited_pid;
  int child_stat;

  waited_pid = waitpid(child_pid, &child_stat, 0);
  printf("Waited pid is %d with status %d\n", waited_pid, child_stat);
  if (waited_pid == -1) {
    perror("Failed to wait");
  }
  ASSERT(child_pid == waited_pid);
  ASSERT(WIFEXITED(child_stat)); /* Clean exit, not a signal. */
  ASSERT(!WIFSIGNALED(child_stat));
  ASSERT(0 == WEXITSTATUS(child_stat));
}